

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void Curl_hash_clean_with_criterium(curl_hash *h,void *user,_func_int_void_ptr_void_ptr *comp)

{
  curl_llist *list_00;
  curl_llist_element *pcVar1;
  int iVar2;
  curl_hash_element *he;
  int i;
  curl_llist *list;
  curl_llist_element *lnext;
  curl_llist_element *le;
  _func_int_void_ptr_void_ptr *comp_local;
  void *user_local;
  curl_hash *h_local;
  
  if (h != (curl_hash *)0x0) {
    for (he._4_4_ = 0; he._4_4_ < h->slots; he._4_4_ = he._4_4_ + 1) {
      list_00 = h->table[he._4_4_];
      pcVar1 = list_00->head;
      while (lnext = pcVar1, lnext != (curl_llist_element *)0x0) {
        pcVar1 = lnext->next;
        iVar2 = (*comp)(user,*lnext->ptr);
        if (iVar2 != 0) {
          Curl_llist_remove(list_00,lnext,h);
          h->size = h->size - 1;
        }
      }
    }
  }
  return;
}

Assistant:

void
Curl_hash_clean_with_criterium(struct curl_hash *h, void *user,
                               int (*comp)(void *, void *))
{
  struct curl_llist_element *le;
  struct curl_llist_element *lnext;
  struct curl_llist *list;
  int i;

  if(!h)
    return;

  for(i = 0; i < h->slots; ++i) {
    list = h->table[i];
    le = list->head; /* get first list entry */
    while(le) {
      struct curl_hash_element *he = le->ptr;
      lnext = le->next;
      /* ask the callback function if we shall remove this entry or not */
      if(comp(user, he->ptr)) {
        Curl_llist_remove(list, le, (void *) h);
        --h->size; /* one less entry in the hash now */
      }
      le = lnext;
    }
  }
}